

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall FIX::SessionID::fromString(SessionID *this,string *str)

{
  string local_240 [32];
  STRING local_220;
  TargetCompID local_200;
  STRING local_1a8;
  TargetCompID local_188;
  STRING local_130;
  SenderCompID local_110;
  STRING local_a8;
  BeginString local_88;
  size_type local_30;
  size_type third;
  size_type second;
  size_type first;
  string *str_local;
  SessionID *this_local;
  
  first = (size_type)str;
  str_local = (string *)this;
  second = std::__cxx11::string::find_first_of((char)str,0x3a);
  third = std::__cxx11::string::find((char *)first,0x41608c);
  local_30 = std::__cxx11::string::find_last_of((char)first,0x3a);
  if ((second != 0xffffffffffffffff) && (third != 0xffffffffffffffff)) {
    std::__cxx11::string::substr((ulong)&local_a8,first);
    BeginString::BeginString(&local_88,&local_a8);
    BeginString::operator=(&this->m_beginString,&local_88);
    BeginString::~BeginString(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::substr((ulong)&local_130,first);
    SenderCompID::SenderCompID(&local_110,&local_130);
    SenderCompID::operator=(&this->m_senderCompID,&local_110);
    SenderCompID::~SenderCompID(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    if (second == local_30) {
      std::__cxx11::string::substr((ulong)&local_1a8,first);
      TargetCompID::TargetCompID(&local_188,&local_1a8);
      TargetCompID::operator=(&this->m_targetCompID,&local_188);
      TargetCompID::~TargetCompID(&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,"");
    }
    else {
      std::__cxx11::string::substr((ulong)&local_220,first);
      TargetCompID::TargetCompID(&local_200,&local_220);
      TargetCompID::operator=(&this->m_targetCompID,&local_200);
      TargetCompID::~TargetCompID(&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::substr((ulong)local_240,first);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,local_240);
      std::__cxx11::string::~string(local_240);
    }
    toString(this,&this->m_frozenString);
  }
  return;
}

Assistant:

void fromString(const std::string &str) {
    std::string::size_type first = str.find_first_of(':');
    std::string::size_type second = str.find("->");
    std::string::size_type third = str.find_last_of(':');
    if (first == std::string::npos) {
      return;
    }
    if (second == std::string::npos) {
      return;
    }
    m_beginString = str.substr(0, first);
    m_senderCompID = str.substr(first + 1, second - first - 1);
    if (first == third) {
      m_targetCompID = str.substr(second + 2);
      m_sessionQualifier = "";
    } else {
      m_targetCompID = str.substr(second + 2, third - second - 2);
      m_sessionQualifier = str.substr(third + 1);
    }
    toString(m_frozenString);
  }